

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cpp
# Opt level: O0

size_t __thiscall RVO::RVOSimulator::addAgent(RVOSimulator *this,Vector2 *position)

{
  Agent *this_00;
  size_type sVar1;
  Agent *local_28;
  Agent *agent;
  Vector2 *position_local;
  RVOSimulator *this_local;
  
  if (this->defaultAgent_ == (Agent *)0x0) {
    this_local = (RVOSimulator *)0xffffffffffffffff;
  }
  else {
    agent = (Agent *)position;
    position_local = (Vector2 *)this;
    this_00 = (Agent *)operator_new(0x98);
    Agent::Agent(this_00,this);
    this_00->position_ =
         (Vector2)(agent->agentNeighbors_).
                  super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    this_00->maxNeighbors_ = this->defaultAgent_->maxNeighbors_;
    this_00->maxSpeed_ = this->defaultAgent_->maxSpeed_;
    this_00->neighborDist_ = this->defaultAgent_->neighborDist_;
    this_00->radius_ = this->defaultAgent_->radius_;
    this_00->timeHorizon_ = this->defaultAgent_->timeHorizon_;
    this_00->timeHorizonObst_ = this->defaultAgent_->timeHorizonObst_;
    this_00->velocity_ = this->defaultAgent_->velocity_;
    local_28 = this_00;
    sVar1 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::size(&this->agents_);
    local_28->id_ = sVar1;
    std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::push_back(&this->agents_,&local_28);
    sVar1 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::size(&this->agents_);
    this_local = (RVOSimulator *)(sVar1 - 1);
  }
  return (size_t)this_local;
}

Assistant:

size_t RVOSimulator::addAgent(const Vector2 &position)
	{
		if (defaultAgent_ == NULL) {
			return RVO_ERROR;
		}

		Agent *agent = new Agent(this);

		agent->position_ = position;
		agent->maxNeighbors_ = defaultAgent_->maxNeighbors_;
		agent->maxSpeed_ = defaultAgent_->maxSpeed_;
		agent->neighborDist_ = defaultAgent_->neighborDist_;
		agent->radius_ = defaultAgent_->radius_;
		agent->timeHorizon_ = defaultAgent_->timeHorizon_;
		agent->timeHorizonObst_ = defaultAgent_->timeHorizonObst_;
		agent->velocity_ = defaultAgent_->velocity_;

		agent->id_ = agents_.size();

		agents_.push_back(agent);

		return agents_.size() - 1;
	}